

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall
IRBuilder::BuildProfiledCallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  int iVar1;
  byte *pbVar2;
  code *pcVar3;
  bool bVar4;
  OpCode OVar5;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar6;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  Instr *pIVar7;
  
  bVar4 = OpCodeAttr::IsProfiledOp(newOpcode);
  if (!bVar4) {
    bVar4 = Js::OpCodeUtil::IsProfiledCallOp(newOpcode);
    if (!bVar4) {
      bVar4 = Js::OpCodeUtil::IsProfiledReturnTypeCallOp(newOpcode);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0x18ca,
                           "(OpCodeAttr::IsProfiledOp(newOpcode) || Js::OpCodeUtil::IsProfiledCallOp(newOpcode) || Js::OpCodeUtil::IsProfiledReturnTypeCallOp(newOpcode))"
                           ,
                           "OpCodeAttr::IsProfiledOp(newOpcode) || Js::OpCodeUtil::IsProfiledCallOp(newOpcode) || Js::OpCodeUtil::IsProfiledReturnTypeCallOp(newOpcode)"
                          );
        if (!bVar4) goto LAB_004e9067;
        *puVar6 = 0;
      }
    }
  }
  bVar4 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x18cb,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar4) goto LAB_004e9067;
    *puVar6 = 0;
  }
  pbVar2 = (this->m_jnReader).m_currentLocation;
  (this->m_jnReader).m_currentLocation = pbVar2 + 0x10;
  if ((this->m_jnReader).m_endLocation < pbVar2 + 0x10) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/ByteCode/ByteCodeReader.h"
                       ,0x68,"(m_currentLocation <= m_endLocation)",
                       "m_currentLocation <= m_endLocation");
    if (!bVar4) goto LAB_004e9067;
    *puVar6 = 0;
  }
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar4 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015bbe90,ClosureRegCheckPhase,sourceContextId,functionId);
  if (!bVar4) {
    DoClosureRegCheck(this,(int)*(short *)(pbVar2 + 1));
    DoClosureRegCheck(this,(uint)*(ushort *)(pbVar2 + 3));
  }
  pIVar7 = BuildProfiledCallIExtended
                     (this,newOpcode,offset,(int)*(short *)(pbVar2 + 1),
                      (uint)*(ushort *)(pbVar2 + 3),(ushort)*pbVar2,*(ProfileId *)(pbVar2 + 0xe),
                      pbVar2[5],*(uint32 *)(pbVar2 + 6),*(CallFlags *)(pbVar2 + 10));
  if (pIVar7->m_opcode != CallIExtendedFlags) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x18d5,"(instr->m_opcode == Js::OpCode::CallIExtendedFlags)",
                       "instr->m_opcode == Js::OpCode::CallIExtendedFlags");
    if (!bVar4) {
LAB_004e9067:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  if (pIVar7->m_opcode == CallIExtendedFlags) {
    iVar1 = *(int *)(pbVar2 + 10);
    if (iVar1 == 1) {
      OVar5 = CallIExtendedNew;
    }
    else if (iVar1 == 8) {
      OVar5 = CallIEval;
    }
    else {
      OVar5 = CallIExtendedFlags;
      if (iVar1 == 0x49) {
        OVar5 = CallIExtendedNewTargetNew;
      }
    }
    pIVar7->m_opcode = OVar5;
  }
  return;
}

Assistant:

void
IRBuilder::BuildProfiledCallIExtendedFlags(Js::OpCode newOpcode, uint32 offset)
{
    Assert(OpCodeAttr::IsProfiledOp(newOpcode) || Js::OpCodeUtil::IsProfiledCallOp(newOpcode)
        || Js::OpCodeUtil::IsProfiledReturnTypeCallOp(newOpcode));
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));
    auto layout = m_jnReader.GetLayout<Js::OpLayoutDynamicProfile<Js::OpLayoutT_CallIExtendedFlags<SizePolicy>>>();

    if (!PHASE_OFF(Js::ClosureRegCheckPhase, m_func))
    {
        this->DoClosureRegCheck(layout->Return);
        this->DoClosureRegCheck(layout->Function);
    }

    IR::Instr* instr = BuildProfiledCallIExtended(newOpcode, offset, layout->Return, layout->Function, layout->ArgCount, layout->profileId, layout->Options, layout->SpreadAuxOffset, layout->callFlags);
    Assert(instr->m_opcode == Js::OpCode::CallIExtendedFlags);
    if (instr->m_opcode == Js::OpCode::CallIExtendedFlags)
    {
        instr->m_opcode =
            layout->callFlags == Js::CallFlags::CallFlags_ExtraArg ? Js::OpCode::CallIEval :
            layout->callFlags == Js::CallFlags::CallFlags_New ? Js::OpCode::CallIExtendedNew :
            layout->callFlags == (Js::CallFlags::CallFlags_New | Js::CallFlags::CallFlags_ExtraArg | Js::CallFlags::CallFlags_NewTarget) ? Js::OpCode::CallIExtendedNewTargetNew :
            instr->m_opcode;
    }
}